

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_FinishConfigure
                  (PaAlsaStreamComponent *self,snd_pcm_hw_params_t *hwParams,
                  PaStreamParameters *params,int primeBuffers,double sampleRate,PaTime *latency)

{
  undefined8 uVar1;
  undefined8 uVar2;
  snd_pcm_t *psVar3;
  long lVar4;
  int iVar5;
  snd_pcm_uframes_t sVar6;
  PaStreamParameters *pPVar7;
  int iVar8;
  size_t __n;
  ulong uVar9;
  pthread_t pVar10;
  char *pcVar11;
  long lVar12;
  snd_pcm_hw_params_t *psVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uStack_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  int local_9c;
  int local_98;
  int __pa_unsure_error_id_12;
  int __pa_unsure_error_id_11;
  int __pa_unsure_error_id_10;
  int __pa_unsure_error_id_9;
  int __pa_unsure_error_id_8;
  int __pa_unsure_error_id_7;
  int __pa_unsure_error_id_6;
  snd_pcm_uframes_t boundary;
  int local_70;
  int __pa_unsure_error_id_5;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int r;
  int __pa_unsure_error_id;
  size_t __alsa_alloca_size;
  snd_pcm_uframes_t bufSz;
  snd_pcm_sw_params_t *swParams;
  PaTime *pPStack_38;
  PaError result;
  PaTime *latency_local;
  double sampleRate_local;
  PaStreamParameters *pPStack_20;
  int primeBuffers_local;
  PaStreamParameters *params_local;
  snd_pcm_hw_params_t *hwParams_local;
  PaAlsaStreamComponent *self_local;
  
  swParams._4_4_ = 0;
  __alsa_alloca_size = 0;
  *latency = -1.0;
  uStack_110 = 0x119f1b;
  pPStack_38 = latency;
  latency_local = (PaTime *)sampleRate;
  sampleRate_local._4_4_ = primeBuffers;
  pPStack_20 = params;
  params_local = (PaStreamParameters *)hwParams;
  hwParams_local = (snd_pcm_hw_params_t *)self;
  __n = (*(code *)alsa_snd_pcm_sw_params_sizeof)();
  lVar4 = -(__n + 0xf & 0xfffffffffffffff0);
  _r = __n;
  bufSz = (snd_pcm_uframes_t)((long)&local_108 + lVar4);
  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x119f47;
  memset((void *)((long)&local_108 + lVar4),0,__n);
  pPVar7 = params_local;
  uVar1 = *(undefined8 *)(hwParams_local + 0x40);
  auVar16._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar16._0_8_ = uVar1;
  auVar16._12_4_ = 0x45300000;
  dVar14 = pPStack_20->suggestedLatency * (double)latency_local +
           (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  uVar9 = (ulong)dVar14;
  __alsa_alloca_size = uVar9 | (long)(dVar14 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f;
  uVar1 = *(undefined8 *)(hwParams_local + 0x38);
  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x119fcb;
  __pa_unsure_error_id_1 =
       (*(code *)alsa_snd_pcm_hw_params_set_buffer_size_near)(uVar1,pPVar7,&__alsa_alloca_size);
  pPVar7 = params_local;
  if (__pa_unsure_error_id_1 < 0) {
    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x119fe6;
    pVar10 = pthread_self();
    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x119ff8;
    iVar8 = pthread_equal(pVar10,paUnixMainThread);
    iVar5 = __pa_unsure_error_id_1;
    if (iVar8 != 0) {
      local_a8 = (long)__pa_unsure_error_id_1;
      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a014;
      pcVar11 = (*alsa_snd_strerror)(iVar5);
      lVar12 = local_a8;
      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a028;
      PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
    }
    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a036;
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2079\n"
                     );
    swParams._4_4_ = -9999;
  }
  else {
    uVar1 = *(undefined8 *)(hwParams_local + 0x38);
    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a059;
    __pa_unsure_error_id_3 = (*(code *)alsa_snd_pcm_hw_params)(uVar1,pPVar7);
    pPVar7 = params_local;
    __pa_unsure_error_id_2 = __pa_unsure_error_id_3;
    if (__pa_unsure_error_id_3 < 0) {
      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a07a;
      pVar10 = pthread_self();
      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a08c;
      iVar8 = pthread_equal(pVar10,paUnixMainThread);
      iVar5 = __pa_unsure_error_id_3;
      if (iVar8 != 0) {
        local_b0 = (long)__pa_unsure_error_id_3;
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a0a8;
        pcVar11 = (*alsa_snd_strerror)(iVar5);
        lVar12 = local_b0;
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a0bc;
        PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
      }
      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a0ca;
      PaUtil_DebugPrint(
                       "Expression \'r\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2092\n"
                       );
      swParams._4_4_ = -9999;
    }
    else {
      if (alsa_snd_pcm_hw_params_get_buffer_size == (undefined1 *)0x0) {
        *(size_t *)(hwParams_local + 0x48) = __alsa_alloca_size;
      }
      else {
        psVar13 = hwParams_local + 0x48;
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a0fd;
        __pa_unsure_error_id_4 = (*(code *)alsa_snd_pcm_hw_params_get_buffer_size)(pPVar7,psVar13);
        if (__pa_unsure_error_id_4 < 0) {
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a118;
          pVar10 = pthread_self();
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a12a;
          iVar8 = pthread_equal(pVar10,paUnixMainThread);
          iVar5 = __pa_unsure_error_id_4;
          if (iVar8 != 0) {
            local_b8 = (long)__pa_unsure_error_id_4;
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a146;
            pcVar11 = (*alsa_snd_strerror)(iVar5);
            lVar12 = local_b8;
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a15a;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
          }
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a168;
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2096\n"
                           );
          return -9999;
        }
      }
      sVar6 = bufSz;
      lVar12 = *(long *)(hwParams_local + 0x48) - *(long *)(hwParams_local + 0x40);
      auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = 0x45300000;
      *pPStack_38 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
                    (double)latency_local;
      uVar1 = *(undefined8 *)(hwParams_local + 0x38);
      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a1dc;
      __pa_unsure_error_id_5 = (*(code *)alsa_snd_pcm_sw_params_current)(uVar1,sVar6);
      sVar6 = bufSz;
      if (__pa_unsure_error_id_5 < 0) {
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a1f7;
        pVar10 = pthread_self();
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a209;
        iVar8 = pthread_equal(pVar10,paUnixMainThread);
        iVar5 = __pa_unsure_error_id_5;
        if (iVar8 != 0) {
          local_c0 = (long)__pa_unsure_error_id_5;
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a225;
          pcVar11 = (*alsa_snd_strerror)(iVar5);
          lVar12 = local_c0;
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a239;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
        }
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a247;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_sw_params_current( self->pcm, swParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2107\n"
                         );
        swParams._4_4_ = -9999;
      }
      else {
        uVar1 = *(undefined8 *)(hwParams_local + 0x38);
        uVar2 = *(undefined8 *)(hwParams_local + 0x40);
        *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a274;
        local_70 = (*(code *)alsa_snd_pcm_sw_params_set_start_threshold)(uVar1,sVar6,uVar2);
        sVar6 = bufSz;
        if (local_70 < 0) {
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a28f;
          pVar10 = pthread_self();
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a2a1;
          iVar8 = pthread_equal(pVar10,paUnixMainThread);
          iVar5 = local_70;
          if (iVar8 != 0) {
            local_c8 = (long)local_70;
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a2bd;
            pcVar11 = (*alsa_snd_strerror)(iVar5);
            lVar12 = local_c8;
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a2d1;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
          }
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a2df;
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2109\n"
                           );
          swParams._4_4_ = -9999;
        }
        else {
          uVar1 = *(undefined8 *)(hwParams_local + 0x38);
          uVar2 = *(undefined8 *)(hwParams_local + 0x48);
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a30c;
          boundary._4_4_ = (*(code *)alsa_snd_pcm_sw_params_set_stop_threshold)(uVar1,sVar6,uVar2);
          sVar6 = bufSz;
          if (boundary._4_4_ < 0) {
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a327;
            pVar10 = pthread_self();
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a339;
            iVar8 = pthread_equal(pVar10,paUnixMainThread);
            iVar5 = boundary._4_4_;
            if (iVar8 != 0) {
              local_d0 = (long)boundary._4_4_;
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a355;
              pcVar11 = (*alsa_snd_strerror)(iVar5);
              lVar12 = local_d0;
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a369;
              PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
            }
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a377;
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2110\n"
                             );
            swParams._4_4_ = -9999;
          }
          else {
            if (sampleRate_local._4_4_ == 0) {
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a3a2;
              __pa_unsure_error_id_8 =
                   (*alsa_snd_pcm_sw_params_get_boundary)
                             ((snd_pcm_sw_params_t *)sVar6,
                              (snd_pcm_uframes_t *)&__pa_unsure_error_id_7);
              sVar6 = bufSz;
              if (__pa_unsure_error_id_8 < 0) {
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a3bd;
                pVar10 = pthread_self();
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a3cf;
                iVar8 = pthread_equal(pVar10,paUnixMainThread);
                iVar5 = __pa_unsure_error_id_8;
                if (iVar8 != 0) {
                  local_d8 = (long)__pa_unsure_error_id_8;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a3eb;
                  pcVar11 = (*alsa_snd_strerror)(iVar5);
                  lVar12 = local_d8;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a3ff;
                  PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
                }
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a40d;
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2116\n"
                                 );
                return -9999;
              }
              uVar1 = *(undefined8 *)(hwParams_local + 0x38);
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a436;
              __pa_unsure_error_id_9 =
                   (*(code *)alsa_snd_pcm_sw_params_set_silence_threshold)(uVar1,sVar6,0);
              sVar6 = bufSz;
              if (__pa_unsure_error_id_9 < 0) {
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a451;
                pVar10 = pthread_self();
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a463;
                iVar8 = pthread_equal(pVar10,paUnixMainThread);
                iVar5 = __pa_unsure_error_id_9;
                if (iVar8 != 0) {
                  local_e0 = (long)__pa_unsure_error_id_9;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a47f;
                  pcVar11 = (*alsa_snd_strerror)(iVar5);
                  lVar12 = local_e0;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a493;
                  PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
                }
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a4a1;
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2117\n"
                                 );
                return -9999;
              }
              uVar1 = *(undefined8 *)(hwParams_local + 0x38);
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a4ca;
              __pa_unsure_error_id_10 =
                   (*(code *)alsa_snd_pcm_sw_params_set_silence_size)
                             (uVar1,sVar6,___pa_unsure_error_id_7);
              if (__pa_unsure_error_id_10 < 0) {
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a4e8;
                pVar10 = pthread_self();
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a4fa;
                iVar8 = pthread_equal(pVar10,paUnixMainThread);
                iVar5 = __pa_unsure_error_id_10;
                if (iVar8 != 0) {
                  local_e8 = (long)__pa_unsure_error_id_10;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a51c;
                  pcVar11 = (*alsa_snd_strerror)(iVar5);
                  lVar12 = local_e8;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a530;
                  PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
                }
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a53e;
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2118\n"
                                 );
                return -9999;
              }
            }
            sVar6 = bufSz;
            uVar1 = *(undefined8 *)(hwParams_local + 0x38);
            uVar2 = *(undefined8 *)(hwParams_local + 0x40);
            *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a56d;
            __pa_unsure_error_id_11 =
                 (*(code *)alsa_snd_pcm_sw_params_set_avail_min)(uVar1,sVar6,uVar2);
            sVar6 = bufSz;
            if (__pa_unsure_error_id_11 < 0) {
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a58b;
              pVar10 = pthread_self();
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a59d;
              iVar8 = pthread_equal(pVar10,paUnixMainThread);
              iVar5 = __pa_unsure_error_id_11;
              if (iVar8 != 0) {
                local_f0 = (long)__pa_unsure_error_id_11;
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a5bf;
                pcVar11 = (*alsa_snd_strerror)(iVar5);
                lVar12 = local_f0;
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a5d3;
                PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
              }
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a5e1;
              PaUtil_DebugPrint(
                               "Expression \'alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2121\n"
                               );
              swParams._4_4_ = -9999;
            }
            else {
              uVar1 = *(undefined8 *)(hwParams_local + 0x38);
              *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a60b;
              __pa_unsure_error_id_12 =
                   (*(code *)alsa_snd_pcm_sw_params_set_xfer_align)(uVar1,sVar6,1);
              sVar6 = bufSz;
              if (__pa_unsure_error_id_12 < 0) {
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a629;
                pVar10 = pthread_self();
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a63b;
                iVar8 = pthread_equal(pVar10,paUnixMainThread);
                iVar5 = __pa_unsure_error_id_12;
                if (iVar8 != 0) {
                  local_f8 = (long)__pa_unsure_error_id_12;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a65d;
                  pcVar11 = (*alsa_snd_strerror)(iVar5);
                  lVar12 = local_f8;
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a671;
                  PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
                }
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a67f;
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2122\n"
                                 );
                swParams._4_4_ = -9999;
              }
              else {
                psVar3 = *(snd_pcm_t **)(hwParams_local + 0x38);
                *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a6a9;
                local_98 = (*alsa_snd_pcm_sw_params_set_tstamp_mode)
                                     (psVar3,(snd_pcm_sw_params_t *)sVar6,SND_PCM_TSTAMP_ENABLE);
                sVar6 = bufSz;
                if (local_98 < 0) {
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a6c7;
                  pVar10 = pthread_self();
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a6d9;
                  iVar8 = pthread_equal(pVar10,paUnixMainThread);
                  iVar5 = local_98;
                  if (iVar8 != 0) {
                    local_100 = (long)local_98;
                    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a6fb;
                    pcVar11 = (*alsa_snd_strerror)(iVar5);
                    lVar12 = local_100;
                    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a70f;
                    PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
                  }
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a71d;
                  PaUtil_DebugPrint(
                                   "Expression \'alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_ENABLE )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2123\n"
                                   );
                  swParams._4_4_ = -9999;
                }
                else {
                  uVar1 = *(undefined8 *)(hwParams_local + 0x38);
                  *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a742;
                  local_9c = (*(code *)alsa_snd_pcm_sw_params)(uVar1,sVar6);
                  if (local_9c < 0) {
                    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a760;
                    pVar10 = pthread_self();
                    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a772;
                    iVar8 = pthread_equal(pVar10,paUnixMainThread);
                    iVar5 = local_9c;
                    if (iVar8 != 0) {
                      local_108 = (long)local_9c;
                      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a794;
                      pcVar11 = (*alsa_snd_strerror)(iVar5);
                      lVar12 = local_108;
                      *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a7a8;
                      PaUtil_SetLastHostErrorInfo(paALSA,lVar12,pcVar11);
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar4) = 0x11a7b6;
                    PaUtil_DebugPrint(
                                     "Expression \'alsa_snd_pcm_sw_params( self->pcm, swParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2126\n"
                                     );
                    swParams._4_4_ = -9999;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return swParams._4_4_;
}

Assistant:

static PaError PaAlsaStreamComponent_FinishConfigure( PaAlsaStreamComponent *self, snd_pcm_hw_params_t* hwParams,
        const PaStreamParameters *params, int primeBuffers, double sampleRate, PaTime* latency )
{
    PaError result = paNoError;
    snd_pcm_sw_params_t* swParams;
    snd_pcm_uframes_t bufSz = 0;
    *latency = -1.;

    alsa_snd_pcm_sw_params_alloca( &swParams );

    bufSz = params->suggestedLatency * sampleRate + self->framesPerPeriod;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( self->pcm, hwParams, &bufSz ), paUnanticipatedHostError );

    /* Set the parameters! */
    {
        int r = alsa_snd_pcm_hw_params( self->pcm, hwParams );
#ifdef PA_ENABLE_DEBUG_OUTPUT
        if( r < 0 )
        {
            snd_output_t *output = NULL;
            alsa_snd_output_stdio_attach( &output, stderr, 0 );
            alsa_snd_pcm_hw_params_dump( hwParams, output );
        }
#endif
        ENSURE_( r, paUnanticipatedHostError );
    }
    if( alsa_snd_pcm_hw_params_get_buffer_size != NULL )
    {
        ENSURE_( alsa_snd_pcm_hw_params_get_buffer_size( hwParams, &self->alsaBufferSize ), paUnanticipatedHostError );
    }
    else
    {
        self->alsaBufferSize = bufSz;
    }

    /* Latency in seconds */
    *latency = (self->alsaBufferSize - self->framesPerPeriod) / sampleRate;

    /* Now software parameters... */
    ENSURE_( alsa_snd_pcm_sw_params_current( self->pcm, swParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_sw_params_set_start_threshold( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_stop_threshold( self->pcm, swParams, self->alsaBufferSize ), paUnanticipatedHostError );

    /* Silence buffer in the case of underrun */
    if( !primeBuffers ) /* XXX: Make sense? */
    {
        snd_pcm_uframes_t boundary;
        ENSURE_( alsa_snd_pcm_sw_params_get_boundary( swParams, &boundary ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_threshold( self->pcm, swParams, 0 ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_sw_params_set_silence_size( self->pcm, swParams, boundary ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_sw_params_set_avail_min( self->pcm, swParams, self->framesPerPeriod ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_xfer_align( self->pcm, swParams, 1 ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_sw_params_set_tstamp_mode( self->pcm, swParams, SND_PCM_TSTAMP_ENABLE ), paUnanticipatedHostError );

    /* Set the parameters! */
    ENSURE_( alsa_snd_pcm_sw_params( self->pcm, swParams ), paUnanticipatedHostError );

error:
    return result;
}